

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall crnlib::dxt1_endpoint_optimizer::compute_selectors_hc(dxt1_endpoint_optimizer *this)

{
  byte bVar1;
  uint uVar2;
  uint a;
  uint b;
  uint a_00;
  uint b_00;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  unique_color *e1_00;
  uchar uVar6;
  uint e23;
  uint e01;
  uint e3;
  uint e2;
  uint e1;
  uint e0;
  color_quad_u8 *c;
  uint iEnd;
  uint i;
  color_quad_u8 c3;
  color_quad_u8 c2;
  color_quad_u8 c1;
  color_quad_u8 c0;
  dxt1_endpoint_optimizer *this_local;
  
  uVar2 = vector<crnlib::unique_color>::size(&this->m_unique_colors);
  vector<unsigned_char>::resize(&(this->m_best_solution).m_selectors,uVar2,false);
  if (((this->m_best_solution).m_enforce_selector & 1U) == 0) {
    dxt1_block::unpack_color
              ((dxt1_block *)&c2,(this->m_best_solution).m_coords.m_low_color,true,0xff);
    dxt1_block::unpack_color
              ((dxt1_block *)&c3,(this->m_best_solution).m_coords.m_high_color,true,0xff);
    color_quad<unsigned_char,_int>::color_quad
              ((color_quad<unsigned_char,_int> *)&i,
               ((uint)c2.field_0.field_0.r * 2 + (uint)c3.field_0.field_0.r +
               (uint)((this->m_best_solution).m_alternate_rounding & 1)) / 3,
               ((uint)c2.field_0.field_0.g * 2 + (uint)c3.field_0.field_0.g +
               (uint)((this->m_best_solution).m_alternate_rounding & 1)) / 3,
               ((uint)c2.field_0.field_0.b * 2 + (uint)c3.field_0.field_0.b +
               (uint)((this->m_best_solution).m_alternate_rounding & 1)) / 3,0);
    color_quad<unsigned_char,_int>::color_quad
              ((color_quad<unsigned_char,_int> *)&iEnd,
               ((uint)c3.field_0.field_0.r * 2 + (uint)c2.field_0.field_0.r +
               (uint)((this->m_best_solution).m_alternate_rounding & 1)) / 3,
               ((uint)c3.field_0.field_0.g * 2 + (uint)c2.field_0.field_0.g +
               (uint)((this->m_best_solution).m_alternate_rounding & 1)) / 3,
               ((uint)c3.field_0.field_0.b * 2 + (uint)c2.field_0.field_0.b +
               (uint)((this->m_best_solution).m_alternate_rounding & 1)) / 3,0);
    c._4_4_ = 0;
    uVar2 = vector<crnlib::unique_color>::size(&this->m_unique_colors);
    for (; c._4_4_ < uVar2; c._4_4_ = c._4_4_ + 1) {
      e1_00 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,c._4_4_);
      a = crnlib::color::color_distance((bool)(this->m_perceptual & 1),&e1_00->m_color,&c2,false);
      b = crnlib::color::color_distance((bool)(this->m_perceptual & 1),&e1_00->m_color,&c3,false);
      a_00 = crnlib::color::color_distance
                       ((bool)(this->m_perceptual & 1),&e1_00->m_color,(color_quad_u8 *)&i,false);
      b_00 = crnlib::color::color_distance
                       ((bool)(this->m_perceptual & 1),&e1_00->m_color,(color_quad_u8 *)&iEnd,false)
      ;
      uVar3 = math::minimum<unsigned_int>(a,b);
      uVar4 = math::minimum<unsigned_int>(a_00,b_00);
      if (uVar4 < uVar3) {
        uVar6 = '\x03';
        if (uVar4 == a_00) {
          uVar6 = '\x02';
        }
      }
      else {
        uVar6 = uVar3 != a;
      }
      puVar5 = vector<unsigned_char>::operator[](&(this->m_best_solution).m_selectors,c._4_4_);
      *puVar5 = uVar6;
    }
  }
  else {
    puVar5 = vector<unsigned_char>::get_ptr(&(this->m_best_solution).m_selectors);
    bVar1 = (this->m_best_solution).m_enforced_selector;
    uVar2 = vector<unsigned_char>::size(&(this->m_best_solution).m_selectors);
    memset(puVar5,(uint)bVar1,(ulong)uVar2);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_selectors_hc()
    {
        m_best_solution.m_selectors.resize(m_unique_colors.size());
        if (m_best_solution.m_enforce_selector)
        {
            memset(m_best_solution.m_selectors.get_ptr(), m_best_solution.m_enforced_selector, m_best_solution.m_selectors.size());
            return;
        }
        color_quad_u8 c0 = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true);
        color_quad_u8 c1 = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true);
        color_quad_u8 c2((c0.r * 2 + c1.r + m_best_solution.m_alternate_rounding) / 3, (c0.g * 2 + c1.g + m_best_solution.m_alternate_rounding) / 3, (c0.b * 2 + c1.b + m_best_solution.m_alternate_rounding) / 3, 0);
        color_quad_u8 c3((c1.r * 2 + c0.r + m_best_solution.m_alternate_rounding) / 3, (c1.g * 2 + c0.g + m_best_solution.m_alternate_rounding) / 3, (c1.b * 2 + c0.b + m_best_solution.m_alternate_rounding) / 3, 0);
        for (uint i = 0, iEnd = m_unique_colors.size(); i < iEnd; i++)
        {
            const color_quad_u8& c = m_unique_colors[i].m_color;
            uint e0 = color::color_distance(m_perceptual, c, c0, false);
            uint e1 = color::color_distance(m_perceptual, c, c1, false);
            uint e2 = color::color_distance(m_perceptual, c, c2, false);
            uint e3 = color::color_distance(m_perceptual, c, c3, false);
            uint e01 = math::minimum(e0, e1);
            uint e23 = math::minimum(e2, e3);
            m_best_solution.m_selectors[i] = e01 <= e23 ? e01 == e0 ? 0 : 1 : e23 == e2 ? 2
                                                                                        : 3;
        }
    }